

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_read_signature
              (mbedtls_ecdsa_context *ctx,uchar *hash,size_t hlen,uchar *sig,size_t slen)

{
  uchar *end_00;
  undefined1 local_80 [8];
  mbedtls_mpi s;
  mbedtls_mpi r;
  size_t len;
  uchar *end;
  uchar *p;
  size_t sStack_30;
  int ret;
  size_t slen_local;
  uchar *sig_local;
  size_t hlen_local;
  uchar *hash_local;
  mbedtls_ecdsa_context *ctx_local;
  
  end_00 = sig + slen;
  end = sig;
  sStack_30 = slen;
  slen_local = (size_t)sig;
  sig_local = (uchar *)hlen;
  hlen_local = (size_t)hash;
  hash_local = (uchar *)ctx;
  mbedtls_mpi_init((mbedtls_mpi *)&s.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_80);
  p._4_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&r.p,0x30);
  if (p._4_4_ == 0) {
    if (end + (long)r.p == end_00) {
      p._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)&s.p);
      if ((p._4_4_ == 0) &&
         (p._4_4_ = mbedtls_asn1_get_mpi(&end,end_00,(mbedtls_mpi *)local_80), p._4_4_ == 0)) {
        p._4_4_ = mbedtls_ecdsa_verify
                            ((mbedtls_ecp_group *)hash_local,(uchar *)hlen_local,(size_t)sig_local,
                             (mbedtls_ecp_point *)(hash_local + 0x110),(mbedtls_mpi *)&s.p,
                             (mbedtls_mpi *)local_80);
        if ((p._4_4_ == 0) && (end != end_00)) {
          p._4_4_ = -0x4c00;
        }
      }
      else {
        p._4_4_ = p._4_4_ + -0x4f80;
      }
    }
    else {
      p._4_4_ = -0x4fe6;
    }
  }
  else {
    p._4_4_ = p._4_4_ + -0x4f80;
  }
  mbedtls_mpi_free((mbedtls_mpi *)&s.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_80);
  return p._4_4_;
}

Assistant:

int mbedtls_ecdsa_read_signature( mbedtls_ecdsa_context *ctx,
                          const unsigned char *hash, size_t hlen,
                          const unsigned char *sig, size_t slen )
{
    int ret;
    unsigned char *p = (unsigned char *) sig;
    const unsigned char *end = sig + slen;
    size_t len;
    mbedtls_mpi r, s;

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( p + len != end )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA +
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
        goto cleanup;
    }

    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &r ) ) != 0 ||
        ( ret = mbedtls_asn1_get_mpi( &p, end, &s ) ) != 0 )
    {
        ret += MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    if( ( ret = mbedtls_ecdsa_verify( &ctx->grp, hash, hlen,
                              &ctx->Q, &r, &s ) ) != 0 )
        goto cleanup;

    if( p != end )
        ret = MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH;

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}